

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O1

bool __thiscall xmrig::Url::isEqual(Url *this,Url *other)

{
  bool bVar1;
  
  if (this->m_tls != other->m_tls) {
    return false;
  }
  if (((this->m_scheme == other->m_scheme) &&
      (bVar1 = String::isEqual(&this->m_host,&other->m_host), bVar1)) &&
     (bVar1 = String::isEqual(&this->m_url,&other->m_url), bVar1)) {
    return this->m_port == other->m_port;
  }
  return false;
}

Assistant:

bool xmrig::Url::isEqual(const Url &other) const
{
    return (m_tls == other.m_tls && m_scheme == other.m_scheme && m_host == other.m_host && m_url == other.m_url && m_port == other.m_port);
}